

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vec_helper.c
# Opt level: O0

void helper_gvec_pmul_b_aarch64(void *vd,void *vn,void *vm,uint32_t desc)

{
  uintptr_t opr_sz_00;
  uintptr_t max_sz;
  uint64_t mask;
  uint64_t rr;
  uint64_t mm;
  uint64_t nn;
  uint64_t *m;
  uint64_t *n;
  uint64_t *d;
  intptr_t opr_sz;
  intptr_t j;
  intptr_t i;
  uint32_t desc_local;
  void *vm_local;
  void *vn_local;
  void *vd_local;
  
  opr_sz_00 = simd_oprsz(desc);
  for (j = 0; j < (long)opr_sz_00 / 8; j = j + 1) {
    mm = *(uint64_t *)((long)vn + j * 8);
    rr = *(uint64_t *)((long)vm + j * 8);
    mask = 0;
    for (opr_sz = 0; opr_sz < 8; opr_sz = opr_sz + 1) {
      mask = rr & (mm & 0x101010101010101) * 0xff ^ mask;
      rr = (rr & 0x7f7f7f7f7f7f7f7f) << 1;
      mm = mm >> 1;
    }
    *(uint64_t *)((long)vd + j * 8) = mask;
  }
  max_sz = simd_maxsz(desc);
  clear_tail(vd,opr_sz_00,max_sz);
  return;
}

Assistant:

void HELPER(gvec_pmul_b)(void *vd, void *vn, void *vm, uint32_t desc)
{
    intptr_t i, j, opr_sz = simd_oprsz(desc);
    uint64_t *d = vd, *n = vn, *m = vm;

    for (i = 0; i < opr_sz / 8; ++i) {
        uint64_t nn = n[i];
        uint64_t mm = m[i];
        uint64_t rr = 0;

        for (j = 0; j < 8; ++j) {
            uint64_t mask = (nn & 0x0101010101010101ull) * 0xff;
            rr ^= mm & mask;
            mm = (mm << 1) & 0xfefefefefefefefeull;
            nn >>= 1;
        }
        d[i] = rr;
    }
    clear_tail(d, opr_sz, simd_maxsz(desc));
}